

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

With * sqlite3WithDup(sqlite3 *db,With *p)

{
  With *pWVar1;
  Select *pSVar2;
  ExprList *pEVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  if (p == (With *)0x0) {
    pWVar1 = (With *)0x0;
  }
  else {
    pWVar1 = (With *)sqlite3DbMallocZero(db,(long)p->nCte * 0x30 + 0x10);
    if ((pWVar1 != (With *)0x0) && (pWVar1->nCte = p->nCte, 0 < p->nCte)) {
      lVar5 = 0x10;
      lVar6 = 0;
      do {
        pSVar2 = sqlite3SelectDup(db,*(Select **)((long)&p->a[0].zName + lVar5),0);
        *(Select **)((long)&pWVar1->a[0].zName + lVar5) = pSVar2;
        pEVar3 = sqlite3ExprListDup(db,*(ExprList **)((long)p->a + lVar5 + -8),0);
        *(ExprList **)((long)pWVar1->a + lVar5 + -8) = pEVar3;
        pcVar4 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar5 + -0x10));
        *(char **)((long)pWVar1->a + lVar5 + -0x10) = pcVar4;
        *(undefined1 *)((long)&pWVar1->a[0].zCteErr + lVar5) =
             *(undefined1 *)((long)&p->a[0].zCteErr + lVar5);
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x30;
      } while (lVar6 < p->nCte);
    }
  }
  return pWVar1;
}

Assistant:

SQLITE_PRIVATE With *sqlite3WithDup(sqlite3 *db, With *p){
  With *pRet = 0;
  if( p ){
    sqlite3_int64 nByte = sizeof(*p) + sizeof(p->a[0]) * (p->nCte-1);
    pRet = sqlite3DbMallocZero(db, nByte);
    if( pRet ){
      int i;
      pRet->nCte = p->nCte;
      for(i=0; i<p->nCte; i++){
        pRet->a[i].pSelect = sqlite3SelectDup(db, p->a[i].pSelect, 0);
        pRet->a[i].pCols = sqlite3ExprListDup(db, p->a[i].pCols, 0);
        pRet->a[i].zName = sqlite3DbStrDup(db, p->a[i].zName);
        pRet->a[i].eM10d = p->a[i].eM10d;
      }
    }
  }
  return pRet;
}